

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyPixels.cpp
# Opt level: O0

void anon_unknown.dwarf_af64a::writeCopyRead
               (Array2D<Imath_3_2::half> *ph1,char *fileName1,char *fileName2,int width,int height,
               int xOffset,int yOffset,Compression comp)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  half *phVar7;
  Header *pHVar8;
  float *pfVar9;
  Vec2<float> *this;
  Vec2<float> *v;
  ChannelList *this_00;
  ChannelList *pCVar10;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  Array2D<Imath_3_2::half> *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar11;
  float fVar12;
  int in_stack_00000008;
  int in_stack_00000010;
  int x;
  int y;
  FrameBuffer fb2;
  FrameBuffer fb1;
  Array2D<Imath_3_2::half> ph2;
  Array2D<Imath_3_2::half> ph1_1;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  InputFile in2;
  InputFile in1;
  OutputFile out_1;
  InputFile in;
  OutputFile out;
  FrameBuffer fb;
  Header hdr;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffb4c;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffb50;
  int local_2d0;
  int local_2cc;
  Slice local_2c8 [56];
  Slice local_290 [56];
  char local_258 [48];
  char local_228 [48];
  Array2D<Imath_3_2::half> local_1f8;
  Array2D<Imath_3_2::half> local_1e0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int *local_1b8;
  undefined1 local_1b0 [32];
  undefined1 local_190 [48];
  InputFile local_160 [32];
  undefined1 local_140 [72];
  char local_f8 [52];
  Channel local_c4 [28];
  Vec2<float> local_a8;
  Vec2<int> local_a0;
  Vec2<int> local_98;
  Box local_90 [16];
  Vec2<int> local_80;
  Vec2<int> local_78;
  Box local_70 [16];
  Header local_60 [60];
  int local_24;
  int local_20;
  int local_1c;
  char *local_18;
  char *local_10;
  Array2D<Imath_3_2::half> *local_8;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"compression ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_stack_00000010);
  poVar4 = std::operator<<(poVar4,":");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  Imath_3_2::Vec2<int>::Vec2(&local_78,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_80,local_1c + -1,local_20 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb50,
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  Imath_3_2::Vec2<int>::Vec2(&local_98,local_24,in_stack_00000008);
  Imath_3_2::Vec2<int>::Vec2(&local_a0,local_24 + -1 + local_1c,in_stack_00000008 + -1 + local_20);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb50,
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  Imath_3_2::Vec2<float>::Vec2(&local_a8,0.0,0.0);
  Imf_3_4::Header::Header
            (local_60,local_70,local_90,1.0,(Vec2 *)&local_a8,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar5 = (int *)Imf_3_4::Header::compression();
  *piVar5 = in_stack_00000010;
  pcVar6 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_c4,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar6,(Channel *)0x231e2f);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x17d09d);
  phVar7 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_8,(long)-in_stack_00000008);
  uVar14 = 0;
  uVar13 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_140 + 0x10),HALF,(char *)(phVar7 + -local_24),2,(long)local_1c * 2,1,1,
             0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_f8,(Slice *)0x231e2f);
  poVar4 = std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  remove(local_10);
  pcVar6 = local_10;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)local_140,pcVar6,local_60,iVar3);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_140);
  Imf_3_4::OutputFile::writePixels((int)local_140);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_140);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x17d203);
  poVar4 = std::operator<<((ostream *)&std::cout," copying");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  remove(local_18);
  pcVar6 = local_10;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_160,pcVar6,iVar3);
  pcVar6 = local_18;
  pHVar8 = (Header *)Imf_3_4::InputFile::header();
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)(local_190 + 0x20),pcVar6,pHVar8,iVar3);
  Imf_3_4::OutputFile::copyPixels((InputFile *)(local_190 + 0x20));
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)(local_190 + 0x20));
  Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffb44,uVar13));
  poVar4 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  pcVar6 = local_10;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)local_190,pcVar6,iVar3);
  pcVar6 = local_18;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)local_1b0,pcVar6,iVar3);
  Imf_3_4::InputFile::header();
  local_1b8 = (int *)Imf_3_4::Header::dataWindow();
  local_1bc = (local_1b8[2] - *local_1b8) + 1;
  local_1c0 = (local_1b8[3] - local_1b8[1]) + 1;
  local_1c4 = *local_1b8;
  local_1c8 = local_1b8[1];
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffb50,CONCAT44(in_stack_fffffffffffffb4c,uVar14),
             CONCAT44(in_stack_fffffffffffffb44,uVar13));
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffb50,CONCAT44(in_stack_fffffffffffffb4c,uVar14),
             CONCAT44(in_stack_fffffffffffffb44,uVar13));
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x17d493);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x17d4a0);
  phVar7 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_1e0,(long)-local_1c8);
  Imf_3_4::Slice::Slice
            (local_290,HALF,(char *)(phVar7 + -local_1c4),2,(long)local_1bc * 2,1,1,0.0,false,false)
  ;
  Imf_3_4::FrameBuffer::insert(local_228,(Slice *)0x231e2f);
  phVar7 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_1f8,(long)-local_1c8);
  uVar14 = 0;
  uVar13 = 0;
  Imf_3_4::Slice::Slice
            (local_2c8,HALF,(char *)(phVar7 + -local_1c4),2,(long)local_1bc * 2,1,1,0.0,false,false)
  ;
  Imf_3_4::FrameBuffer::insert(local_258,(Slice *)0x231e2f);
  Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)local_190);
  Imf_3_4::InputFile::readPixels((int)local_190,local_1b8[1]);
  Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)local_1b0);
  Imf_3_4::InputFile::readPixels((int)local_1b0,local_1b8[1]);
  poVar4 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  Imf_3_4::InputFile::header();
  Imf_3_4::Header::displayWindow();
  Imf_3_4::Header::displayWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb50,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffb4c,uVar14));
  if (!bVar1) {
    __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                  ,0x92,
                  "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::InputFile::header();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb50,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffb4c,uVar14));
  if (!bVar1) {
    __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                  ,0x93,
                  "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::InputFile::header();
  pfVar9 = (float *)Imf_3_4::Header::pixelAspectRatio();
  fVar11 = *pfVar9;
  pfVar9 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if ((fVar11 != *pfVar9) || (NAN(fVar11) || NAN(*pfVar9))) {
    __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                  ,0x94,
                  "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::InputFile::header();
  this = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  bVar1 = Imath_3_2::Vec2<float>::operator==(this,v);
  if (!bVar1) {
    __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                  ,0x96,
                  "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                 );
  }
  Imf_3_4::InputFile::header();
  pfVar9 = (float *)Imf_3_4::Header::screenWindowWidth();
  fVar11 = *pfVar9;
  pfVar9 = (float *)Imf_3_4::Header::screenWindowWidth();
  if ((fVar11 == *pfVar9) && (!NAN(fVar11) && !NAN(*pfVar9))) {
    Imf_3_4::InputFile::header();
    piVar5 = (int *)Imf_3_4::Header::lineOrder();
    iVar3 = *piVar5;
    piVar5 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar3 != *piVar5) {
      __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x98,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    piVar5 = (int *)Imf_3_4::Header::compression();
    iVar3 = *piVar5;
    piVar5 = (int *)Imf_3_4::Header::compression();
    if (iVar3 == *piVar5) {
      Imf_3_4::InputFile::header();
      this_00 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar10 = (ChannelList *)Imf_3_4::Header::channels();
      bVar2 = Imf_3_4::ChannelList::operator==(this_00,pCVar10);
      if ((bVar2 & 1) == 0) {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                      ,0x9a,
                      "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                     );
      }
      local_2cc = 0;
      do {
        if (local_1c0 <= local_2cc) {
          Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x17dc94);
          Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x17dca1);
          Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffb44,uVar13));
          Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffb44,uVar13));
          Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffb44,uVar13));
          Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffb44,uVar13));
          remove(local_10);
          remove(local_18);
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          Imf_3_4::Header::~Header(local_60);
          return;
        }
        for (local_2d0 = 0; local_2d0 < local_1bc; local_2d0 = local_2d0 + 1) {
          Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_1e0,(long)local_2cc);
          fVar11 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffb44,uVar13));
          Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_1f8,(long)local_2cc);
          fVar12 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffb44,uVar13));
          if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
            __assert_fail("ph1[y][x] == ph2[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                          ,0x9e,
                          "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                         );
          }
        }
        local_2cc = local_2cc + 1;
      } while( true );
    }
    __assert_fail("in2.header ().compression () == hdr.compression ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                  ,0x99,
                  "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                 );
  }
  __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                ,0x97,
                "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
               );
}

Assistant:

void
writeCopyRead (
    const Array2D<half>& ph1,
    const char           fileName1[],
    const char           fileName2[],
    int                  width,
    int                  height,
    int                  xOffset,
    int                  yOffset,
    Compression          comp)
{
    //
    // Write the pixel data in ph1 to an image file using the
    // specified compression type and subsampling rates.
    // Then copy the image file using OutputFile::copyPixels()
    // Read the pixel data back from the copied file verify
    // that the data are the same as those in ph1.
    //

    cout << "compression " << comp << ":" << flush;

    Header hdr (
        (Box2i (
            V2i (0, 0), // display window
            V2i (width - 1, height - 1))),
        (Box2i (
            V2i (xOffset, yOffset), // data window
            V2i (xOffset + width - 1, yOffset + height - 1))));

    hdr.compression () = comp;
    hdr.channels ().insert ("H", Channel (HALF, 1, 1));

    {
        FrameBuffer fb;

        fb.insert (
            "H", // name
            Slice (
                HALF,                             // type
                (char*) &ph1[-yOffset][-xOffset], // base
                sizeof (ph1[0][0]),               // xStride
                sizeof (ph1[0][0]) * width,       // yStride
                1,                                // xSampling
                1)                                // ySampling
        );

        cout << " writing" << flush;

        remove (fileName1);
        OutputFile out (fileName1, hdr);
        out.setFrameBuffer (fb);
        out.writePixels (height);
    }

    {
        cout << " copying" << flush;

        remove (fileName2);
        InputFile  in (fileName1);
        OutputFile out (fileName2, in.header ());
        out.copyPixels (in);
    }

    {
        cout << " reading" << flush;

        InputFile in1 (fileName1);
        InputFile in2 (fileName2);

        const Box2i& dw = in2.header ().dataWindow ();
        int          w  = dw.max.x - dw.min.x + 1;
        int          h  = dw.max.y - dw.min.y + 1;
        int          dx = dw.min.x;
        int          dy = dw.min.y;

        Array2D<half> ph1 (h, w);
        Array2D<half> ph2 (h, w);

        FrameBuffer fb1;
        FrameBuffer fb2;

        fb1.insert (
            "H", // name
            Slice (
                HALF,                   // type
                (char*) &ph1[-dy][-dx], // base
                sizeof (ph1[0][0]),     // xStride
                sizeof (ph1[0][0]) * w, // yStride
                1,                      // xSampling
                1)                      // ySampling
        );

        fb2.insert (
            "H", // name
            Slice (
                HALF,                   // type
                (char*) &ph2[-dy][-dx], // base
                sizeof (ph2[0][0]),     // xStride
                sizeof (ph2[0][0]) * w, // yStride
                1,                      // xSampling
                1)                      // ySampling
        );

        in1.setFrameBuffer (fb1);
        in1.readPixels (dw.min.y, dw.max.y);
        in2.setFrameBuffer (fb2);
        in2.readPixels (dw.min.y, dw.max.y);

        cout << " comparing" << flush;

        assert (in2.header ().displayWindow () == hdr.displayWindow ());
        assert (in2.header ().dataWindow () == hdr.dataWindow ());
        assert (in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ());
        assert (
            in2.header ().screenWindowCenter () == hdr.screenWindowCenter ());
        assert (in2.header ().screenWindowWidth () == hdr.screenWindowWidth ());
        assert (in2.header ().lineOrder () == hdr.lineOrder ());
        assert (in2.header ().compression () == hdr.compression ());
        assert (in2.header ().channels () == hdr.channels ());

        for (int y = 0; y < h; ++y)
            for (int x = 0; x < w; ++x)
                assert (ph1[y][x] == ph2[y][x]);
    }

    remove (fileName1);
    remove (fileName2);
    cout << endl;
}